

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ar.c
# Opt level: O0

int archive_write_ar_finish_entry(archive_write *a)

{
  long *plVar1;
  int ret;
  ar_w *ar;
  archive_write *a_local;
  
  plVar1 = (long *)a->format_data;
  if (*plVar1 == 0) {
    if (plVar1[1] == 0) {
      a_local._4_4_ = 0;
    }
    else if (plVar1[1] == 1) {
      a_local._4_4_ = __archive_write_output(a,"\n",1);
    }
    else {
      archive_set_error(&a->archive,-1,"Padding wrong size: %ju should be 1 or 0",plVar1[1]);
      a_local._4_4_ = -0x14;
    }
  }
  else {
    archive_set_error(&a->archive,-1,"Entry remaining bytes larger than 0");
    a_local._4_4_ = -0x14;
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_write_ar_finish_entry(struct archive_write *a)
{
	struct ar_w *ar;
	int ret;

	ar = (struct ar_w *)a->format_data;

	if (ar->entry_bytes_remaining != 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Entry remaining bytes larger than 0");
		return (ARCHIVE_WARN);
	}

	if (ar->entry_padding == 0) {
		return (ARCHIVE_OK);
	}

	if (ar->entry_padding != 1) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Padding wrong size: %ju should be 1 or 0",
		    (uintmax_t)ar->entry_padding);
		return (ARCHIVE_WARN);
	}

	ret = __archive_write_output(a, "\n", 1);
	return (ret);
}